

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

int __thiscall
glslang::TIntermediate::addUsedLocation
          (TIntermediate *this,TQualifier *qualifier,TType *type,bool *typeCollision)

{
  pointer *ppTVar1;
  pointer *ppTVar2;
  pointer pTVar3;
  iterator __position;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar11;
  long lVar12;
  TIoRange *__args;
  ulong uVar13;
  EShLanguage stage;
  iterator iVar14;
  TType *type_00;
  long lVar15;
  vector<glslang::TIoRange,std::allocator<glslang::TIoRange>> *this_00;
  uint set;
  ulong uVar16;
  TIoRange range;
  TIoRange range2;
  undefined1 local_e8 [8];
  TRange TStack_e0;
  TBasicType local_d8;
  uint uStack_d4;
  bool bStack_d0;
  bool bStack_cf;
  bool bStack_ce;
  bool bStack_cd;
  uint uStack_cc;
  TIoRange local_50;
  
  *typeCollision = false;
  uVar6 = (uint)*(ulong *)&qualifier->field_0x8;
  uVar11 = uVar6 & 0x7f;
  switch(uVar11) {
  case 3:
  case 0x14:
  case 0x15:
  case 0x19:
  case 0x1a:
  case 0x1b:
    set = 0;
    goto LAB_003f4f7a;
  case 4:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1c:
  case 0x1d:
  case 0x1e:
    set = 1;
LAB_003f4f7a:
    iVar9 = 1;
    if (1 < uVar11 - 9) break;
    goto LAB_003f5012;
  case 5:
    set = 2;
    break;
  case 6:
    set = 3;
    break;
  default:
    if (1 < uVar11 - 9) {
      set = 1;
      if (((uVar6 & 0x7e) != 0xc) && (set = 2, (uVar6 & 0x7f) != 0xe)) {
        return -1;
      }
      goto LAB_003f4f7a;
    }
    iVar9 = 1;
    set = 0;
    goto LAB_003f5012;
  case 0x1f:
    set = 4;
  }
  iVar9 = 1;
  if ((uVar6 & 0x7e) != 0xc) {
    if ((*(ulong *)&qualifier->field_0x8 >> 0x2b & 1) == 0 && 1 < uVar11 - 5) {
      iVar9 = (*type->_vptr_TType[0x1d])();
      if (((char)iVar9 == '\0') ||
         (bVar5 = TQualifier::isArrayedIo(qualifier,this->language), !bVar5)) {
        stage = this->language;
        type_00 = type;
      }
      else {
        TType::TType((TType *)local_e8,type,0,false);
        stage = this->language;
        type_00 = (TType *)local_e8;
      }
      iVar9 = computeTypeLocationSize(type_00,stage);
    }
    else {
      iVar7 = (*type->_vptr_TType[0x1e])();
      if ((char)iVar7 != '\0') {
        iVar9 = (*type->_vptr_TType[0x11])();
      }
    }
  }
LAB_003f5012:
  uVar11 = (uint)*(undefined8 *)&qualifier->field_0x8;
  uVar6 = uVar11 & 0x7f;
  if (((uVar6 == 0xe) || ((uVar11 & 0x7e) == 0xc)) || (uVar6 - 9 < 2)) {
    uVar6 = *(uint *)&qualifier->field_0x1c;
    uVar11 = uVar6 & 0xfff;
    local_e8 = (undefined1  [8])(CONCAT44(uVar6,uVar6) & 0xfff00000fff);
    pTVar3 = this->usedIoRT[set].
             super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
             super__Vector_impl_data._M_start;
    __position._M_current =
         this->usedIoRT[set].super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((long)__position._M_current - (long)pTVar3 != 0) {
      lVar12 = (long)__position._M_current - (long)pTVar3 >> 3;
      lVar15 = 0;
      do {
        if ((pTVar3[lVar15].start <= (int)uVar11) && ((int)uVar11 <= pTVar3[lVar15].last)) {
          return uVar11;
        }
        lVar15 = lVar15 + 1;
      } while (lVar12 + (ulong)(lVar12 == 0) != lVar15);
    }
    if (__position._M_current ==
        this->usedIoRT[set].super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<glslang::TRange,std::allocator<glslang::TRange>>::
      _M_realloc_insert<glslang::TRange_const&>
                ((vector<glslang::TRange,std::allocator<glslang::TRange>> *)
                 &this->usedIoRT[set].
                  super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>,__position,
                 (TRange *)local_e8);
    }
    else {
      (__position._M_current)->start = local_e8._0_4_;
      (__position._M_current)->last = local_e8._4_4_;
      ppTVar2 = &this->usedIoRT[set].
                 super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar2 = *ppTVar2 + 1;
    }
    return -1;
  }
  if (((iVar9 == 2) && (iVar7 = (*type->_vptr_TType[7])(type), iVar7 == 2)) &&
     ((iVar7 = (*type->_vptr_TType[0xc])(type), iVar7 == 3 &&
      ((uVar6 = *(uint *)&qualifier->field_0x8 & 0x7f, uVar6 - 0x14 < 0xb || (uVar6 - 3 < 2)))))) {
    uVar8 = (undefined4)*(undefined8 *)&qualifier->field_0x1c;
    local_d8 = (*type->_vptr_TType[7])(type);
    uVar16 = *(ulong *)&qualifier->field_0x8;
    bStack_d0 = (bool)((byte)(uVar16 >> 0x1d) & 1);
    bStack_cf = (bool)((byte)(uVar16 >> 0x1e) & 1);
    bStack_ce = (bool)((byte)(uVar16 >> 0x1f) & 1);
    bStack_cd = (bool)((byte)(uVar16 >> 0x2d) & 1);
    TStack_e0.start = 0;
    TStack_e0.last = 3;
    uStack_d4 = 0;
    uStack_cc = CONCAT31(uStack_cc._1_3_,(char)(uVar16 >> 0x2c)) & 0xffffff01;
    local_e8 = (undefined1  [8])(CONCAT44(uVar8,uVar8) & 0xfff00000fff);
    iVar9 = checkLocationRange(this,set,(TIoRange *)local_e8,type,typeCollision);
    if (-1 < iVar9) {
      return iVar9;
    }
    this_00 = (vector<glslang::TIoRange,std::allocator<glslang::TIoRange>> *)
              &this->usedIo[set].
               super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>;
    iVar14._M_current =
         this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<glslang::TIoRange,std::allocator<glslang::TIoRange>>::
      _M_realloc_insert<glslang::TIoRange_const&>(this_00,iVar14,(TIoRange *)local_e8);
    }
    else {
      (iVar14._M_current)->basicType = local_d8;
      (iVar14._M_current)->index = uStack_d4;
      (iVar14._M_current)->centroid = bStack_d0;
      (iVar14._M_current)->smooth = bStack_cf;
      (iVar14._M_current)->flat = bStack_ce;
      (iVar14._M_current)->sample = bStack_cd;
      (iVar14._M_current)->patch = (bool)(char)uStack_cc;
      *(int3 *)&(iVar14._M_current)->field_0x1d = (int3)(uStack_cc >> 8);
      ((iVar14._M_current)->location).start = local_e8._0_4_;
      ((iVar14._M_current)->location).last = local_e8._4_4_;
      ((iVar14._M_current)->component).start = TStack_e0.start;
      ((iVar14._M_current)->component).last = TStack_e0.last;
      ppTVar1 = &this->usedIo[set].
                 super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    uVar4 = *(undefined8 *)&qualifier->field_0x1c;
    local_50.basicType = (*type->_vptr_TType[7])();
    uVar16 = *(ulong *)&qualifier->field_0x8;
    local_50.component.start = 0;
    local_50.component.last = 1;
    local_50.index = 0;
    local_50._24_4_ =
         CONCAT13((char)(uVar16 >> 0x2d),
                  CONCAT12((char)(uVar16 >> 0x1f),
                           CONCAT11((char)(uVar16 >> 0x1e),(char)(uVar16 >> 0x1d)))) & 0x1010101;
    local_50._28_4_ = CONCAT31(local_50._29_3_,(char)(uVar16 >> 0x2c)) & 0xffffff01;
    local_50.location = (TRange)((ulong)((uint)uVar4 & 0xfff) * 0x100000001 + 0x100000001);
    iVar9 = checkLocationRange(this,set,&local_50,type,typeCollision);
    if (-1 < iVar9) {
      return iVar9;
    }
    iVar14._M_current =
         this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      __args = &local_50;
LAB_003f5471:
      std::vector<glslang::TIoRange,std::allocator<glslang::TIoRange>>::
      _M_realloc_insert<glslang::TIoRange_const&>(this_00,iVar14,__args);
      return iVar9;
    }
  }
  else {
    uVar6 = (uint)*(undefined8 *)&qualifier->field_0x1c;
    if (((uVar6 & 0x7000) == 0x4000) && (iVar7 = (*type->_vptr_TType[0xc])(type), iVar7 < 1)) {
      uVar13 = 0x300000000;
      uVar16 = 0;
    }
    else {
      iVar7 = (*type->_vptr_TType[0xc])(type);
      iVar10 = (*type->_vptr_TType[7])(type);
      uVar16 = 0;
      if ((*(uint *)&qualifier->field_0x1c & 0x7000) != 0x4000) {
        uVar16 = (ulong)(*(uint *)&qualifier->field_0x1c >> 0xc) & 0xffffffff00000007;
      }
      uVar13 = (ulong)(((iVar7 << (iVar10 == 2)) + (int)uVar16) - 1) << 0x20;
    }
    local_d8 = (*type->_vptr_TType[7])();
    if (local_d8 == EbtSampler) {
      iVar7 = (*type->_vptr_TType[8])();
      local_d8 = EbtSampler;
      if (*(char *)(CONCAT44(extraout_var,iVar7) + 1) == '\b') {
        iVar7 = (*type->_vptr_TType[8])();
        local_d8 = (TBasicType)*(byte *)CONCAT44(extraout_var_00,iVar7);
      }
    }
    local_e8 = (undefined1  [8])(CONCAT44((uVar6 & 0xfff) + iVar9 + -1,uVar6) & 0xffffffff00000fff);
    TStack_e0 = (TRange)(uVar16 | uVar13);
    uVar16 = *(ulong *)&qualifier->field_0x8;
    uStack_d4 = (ushort)((ulong)*(undefined8 *)&qualifier->field_0x1c >> 0x30) & 0xff;
    if ((char)((ulong)*(undefined8 *)&qualifier->field_0x1c >> 0x30) == -1) {
      uStack_d4 = 0;
    }
    bStack_d0 = (bool)((byte)(uVar16 >> 0x1d) & 1);
    bStack_cf = (bool)((byte)(uVar16 >> 0x1e) & 1);
    bStack_ce = (bool)((byte)(uVar16 >> 0x1f) & 1);
    bStack_cd = (bool)((byte)(uVar16 >> 0x2d) & 1);
    uStack_cc = CONCAT31(uStack_cc._1_3_,(char)(uVar16 >> 0x2c)) & 0xffffff01;
    if ((((this->profile == EEsProfile) || (this->language != EShLangVertex)) ||
        (0x1b < ((uint)uVar16 & 0x7f))) ||
       (((0xe300008U >> ((uint)uVar16 & 0x1f) & 1) == 0 || (0 < (this->spvVersion).vulkan)))) {
      iVar9 = checkLocationRange(this,set,(TIoRange *)local_e8,type,typeCollision);
      if (-1 < iVar9) {
        return iVar9;
      }
    }
    else {
      iVar9 = -1;
    }
    this_00 = (vector<glslang::TIoRange,std::allocator<glslang::TIoRange>> *)
              &this->usedIo[set].
               super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>;
    iVar14._M_current =
         this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar14._M_current ==
        this->usedIo[set].super__Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      __args = (TIoRange *)local_e8;
      goto LAB_003f5471;
    }
    local_50._24_4_ = CONCAT13(bStack_cd,CONCAT12(bStack_ce,CONCAT11(bStack_cf,bStack_d0)));
    local_50.location.start = local_e8._0_4_;
    local_50.location.last = local_e8._4_4_;
    local_50.component.start = TStack_e0.start;
    local_50.component.last = TStack_e0.last;
    local_50.basicType = local_d8;
    local_50.index = uStack_d4;
    local_50._28_4_ = uStack_cc;
  }
  (iVar14._M_current)->basicType = local_50.basicType;
  (iVar14._M_current)->index = local_50.index;
  (iVar14._M_current)->centroid = (bool)(char)local_50._24_4_;
  (iVar14._M_current)->smooth = (bool)(char)((uint)local_50._24_4_ >> 8);
  (iVar14._M_current)->flat = (bool)(char)((uint)local_50._24_4_ >> 0x10);
  (iVar14._M_current)->sample = (bool)(char)((uint)local_50._24_4_ >> 0x18);
  *(undefined4 *)&(iVar14._M_current)->patch = local_50._28_4_;
  ((iVar14._M_current)->location).start = local_50.location.start;
  ((iVar14._M_current)->location).last = local_50.location.last;
  ((iVar14._M_current)->component).start = local_50.component.start;
  ((iVar14._M_current)->component).last = local_50.component.last;
  ppTVar1 = &(((_Vector_base<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *)this_00)->
             _M_impl).super__Vector_impl_data._M_finish;
  *ppTVar1 = *ppTVar1 + 1;
  return iVar9;
}

Assistant:

int TIntermediate::addUsedLocation(const TQualifier& qualifier, const TType& type, bool& typeCollision)
{
    typeCollision = false;

    int set;
    if (qualifier.isPipeInput())
        set = 0;
    else if (qualifier.isPipeOutput())
        set = 1;
    else if (qualifier.storage == EvqUniform)
        set = 2;
    else if (qualifier.storage == EvqBuffer)
        set = 3;
    else if (qualifier.storage == EvqTileImageEXT)
        set = 4;
    else if (qualifier.isAnyPayload())
        set = 0;
    else if (qualifier.isAnyCallable())
        set = 1;
    else if (qualifier.isHitObjectAttrNV())
        set = 2;
    else
        return -1;

    int size;
    if (qualifier.isAnyPayload() || qualifier.isAnyCallable()) {
        size = 1;
    } else if (qualifier.isUniformOrBuffer() || qualifier.isTaskMemory()) {
        if (type.isSizedArray())
            size = type.getCumulativeArraySize();
        else
            size = 1;
    } else {
        // Strip off the outer array dimension for those having an extra one.
        if (type.isArray() && qualifier.isArrayedIo(language)) {
            TType elementType(type, 0);
            size = computeTypeLocationSize(elementType, language);
        } else
            size = computeTypeLocationSize(type, language);
    }

    // Locations, and components within locations.
    //
    // Almost always, dealing with components means a single location is involved.
    // The exception is a dvec3. From the spec:
    //
    // "A dvec3 will consume all four components of the first location and components 0 and 1 of
    // the second location. This leaves components 2 and 3 available for other component-qualified
    // declarations."
    //
    // That means, without ever mentioning a component, a component range
    // for a different location gets specified, if it's not a vertex shader input. (!)
    // (A vertex shader input will show using only one location, even for a dvec3/4.)
    //
    // So, for the case of dvec3, we need two independent ioRanges.
    //
    // For raytracing IO (payloads and callabledata) each declaration occupies a single
    // slot irrespective of type.
    int collision = -1; // no collision
    if (qualifier.isAnyPayload() || qualifier.isAnyCallable() || qualifier.isHitObjectAttrNV()) {
        TRange range(qualifier.layoutLocation, qualifier.layoutLocation);
        collision = checkLocationRT(set, qualifier.layoutLocation);
        if (collision < 0)
            usedIoRT[set].push_back(range);
        return collision;
    }
    if (size == 2 && type.getBasicType() == EbtDouble && type.getVectorSize() == 3 &&
        (qualifier.isPipeInput() || qualifier.isPipeOutput())) {
        // Dealing with dvec3 in/out split across two locations.
        // Need two io-ranges.
        // The case where the dvec3 doesn't start at component 0 was previously caught as overflow.

        // First range:
        TRange locationRange(qualifier.layoutLocation, qualifier.layoutLocation);
        TRange componentRange(0, 3);
        TIoRange range(locationRange, componentRange, type.getBasicType(), 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

        // check for collisions
        collision = checkLocationRange(set, range, type, typeCollision);
        if (collision < 0) {
            usedIo[set].push_back(range);

            // Second range:
            TRange locationRange2(qualifier.layoutLocation + 1, qualifier.layoutLocation + 1);
            TRange componentRange2(0, 1);
            TIoRange range2(locationRange2, componentRange2, type.getBasicType(), 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

            // check for collisions
            collision = checkLocationRange(set, range2, type, typeCollision);
            if (collision < 0)
                usedIo[set].push_back(range2);
        }
        return collision;
    }

    // Not a dvec3 in/out split across two locations, generic path.
    // Need a single IO-range block.

    TRange locationRange(qualifier.layoutLocation, qualifier.layoutLocation + size - 1);
    TRange componentRange(0, 3);
    if (qualifier.hasComponent() || type.getVectorSize() > 0) {
        int consumedComponents = type.getVectorSize() * (type.getBasicType() == EbtDouble ? 2 : 1);
        if (qualifier.hasComponent())
            componentRange.start = qualifier.layoutComponent;
        componentRange.last  = componentRange.start + consumedComponents - 1;
    }

    // combine location and component ranges
    TBasicType basicTy = type.getBasicType();
    if (basicTy == EbtSampler && type.getSampler().isAttachmentEXT())
        basicTy = type.getSampler().type;
    TIoRange range(locationRange, componentRange, basicTy, qualifier.hasIndex() ? qualifier.getIndex() : 0, qualifier.centroid, qualifier.smooth, qualifier.flat, qualifier.sample, qualifier.patch);

    // check for collisions, except for vertex inputs on desktop targeting OpenGL
    if (! (!isEsProfile() && language == EShLangVertex && qualifier.isPipeInput()) || spvVersion.vulkan > 0)
        collision = checkLocationRange(set, range, type, typeCollision);

    if (collision < 0)
        usedIo[set].push_back(range);

    return collision;
}